

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pla.h
# Opt level: O0

Pla_Man_t * Pla_ManAlloc(char *pFileName,int nIns,int nOuts,int nCubes)

{
  int iVar1;
  Pla_Man_t *p_00;
  char *pcVar2;
  Pla_Man_t *p;
  int nCubes_local;
  int nOuts_local;
  int nIns_local;
  char *pFileName_local;
  
  p_00 = (Pla_Man_t *)calloc(1,0x98);
  pcVar2 = Extra_FileDesignName(pFileName);
  p_00->pName = pcVar2;
  pcVar2 = Abc_UtilStrsav(pFileName);
  p_00->pSpec = pcVar2;
  p_00->nIns = nIns;
  p_00->nOuts = nOuts;
  iVar1 = Abc_Bit6WordNum(nIns << 1);
  p_00->nInWords = iVar1;
  iVar1 = Abc_Bit6WordNum(nOuts << 1);
  p_00->nOutWords = iVar1;
  Vec_IntFillNatural(&p_00->vCubes,nCubes);
  iVar1 = Pla_ManCubeNum(p_00);
  Vec_WrdFill(&p_00->vInBits,iVar1 * p_00->nInWords,0);
  iVar1 = Pla_ManCubeNum(p_00);
  Vec_WrdFill(&p_00->vOutBits,iVar1 * p_00->nOutWords,0);
  return p_00;
}

Assistant:

static inline Pla_Man_t * Pla_ManAlloc( char * pFileName, int nIns, int nOuts, int nCubes )
{
    Pla_Man_t * p = ABC_CALLOC( Pla_Man_t, 1 );
    p->pName = Extra_FileDesignName( pFileName );
    p->pSpec = Abc_UtilStrsav( pFileName );
    p->nIns  = nIns;
    p->nOuts = nOuts;
    p->nInWords  = Abc_Bit6WordNum( 2*nIns );
    p->nOutWords = Abc_Bit6WordNum( 2*nOuts );
    Vec_IntFillNatural( &p->vCubes, nCubes );
    Vec_WrdFill( &p->vInBits,  Pla_ManCubeNum(p) * p->nInWords,  0 );
    Vec_WrdFill( &p->vOutBits, Pla_ManCubeNum(p) * p->nOutWords, 0 );
    return p;
}